

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBars<int>
               (char *label_id,int *xs,int *ys,int *neg,int *pos,int count,int offset,int stride)

{
  undefined1 local_68 [8];
  GetterError<int> getter;
  int count_local;
  int *pos_local;
  int *neg_local;
  int *ys_local;
  int *xs_local;
  char *label_id_local;
  
  getter._44_4_ = count;
  GetterError<int>::GetterError((GetterError<int> *)local_68,xs,ys,neg,pos,count,offset,stride);
  PlotErrorBarsEx<ImPlot::GetterError<int>>(label_id,(GetterError<int> *)local_68);
  return;
}

Assistant:

void PlotErrorBars(const char* label_id, const T* xs, const T* ys, const T* neg, const T* pos, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, neg, pos, count, offset, stride);
    PlotErrorBarsEx(label_id, getter);
}